

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O3

void nn_sinproc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_fsm *unaff_RBX;
  uint unaff_EBP;
  ulong unaff_R14;
  nn_fsm *pnVar2;
  
  if (self->state == 3) {
    unaff_R14 = (ulong)(uint)src;
    if (src == 0x6c41) {
      if (type != 5) {
        pnVar2 = self + 1;
        if (*(int *)&self[1].fn != 6) goto LAB_0012b3cc;
        if (type == 6) {
          *(undefined4 *)&pnVar2->fn = 7;
        }
      }
      goto LAB_0012b339;
    }
    if (src == -2) {
      if (type == 5) goto LAB_0012b339;
      if (type != -3) goto LAB_0012b3b5;
      if ((*(uint *)&self[1].fn | 4) == 5) {
        *(undefined4 *)&self[1].fn = 7;
LAB_0012b339:
        if (*(int *)&self[1].fn != 7) {
          return;
        }
        iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[6].owner);
        if (iVar1 != 0) {
          return;
        }
        iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[6].stopped.type);
        if (iVar1 != 0) {
          return;
        }
        iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[5].ctx);
        unaff_RBX = self;
        if (iVar1 != 0) goto LAB_0012b3a6;
        iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[5].stopped.item);
        if (iVar1 == 0) {
          nn_fsm_stopped(self,7);
          return;
        }
        goto LAB_0012b3ab;
      }
      nn_pipebase_stop((nn_pipebase *)&self[1].state);
      if (0xfffffffd < self->state - 4U) {
        nn_fsm_raiseto(self,(nn_fsm *)self[1].shutdown_fn,
                       (nn_fsm_event *)&((nn_fsm *)self[1].shutdown_fn)[6].stopped.type,0x6c41,6,
                       self);
        *(undefined4 *)&self[1].fn = 6;
        goto LAB_0012b339;
      }
      goto LAB_0012b3b0;
    }
  }
  else {
    nn_sinproc_shutdown_cold_1();
    type = unaff_EBP;
LAB_0012b3a6:
    nn_sinproc_shutdown_cold_2();
LAB_0012b3ab:
    nn_sinproc_shutdown_cold_3();
    self = unaff_RBX;
LAB_0012b3b0:
    nn_sinproc_shutdown_cold_4();
  }
LAB_0012b3b5:
  pnVar2 = self + 1;
  if (*(int *)&self[1].fn == 6) {
    nn_sinproc_shutdown_cold_5();
  }
LAB_0012b3cc:
  nn_backtrace_print();
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
          (ulong)*(uint *)&pnVar2->fn,unaff_R14 & 0xffffffff,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
          ,0x10c);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_sinproc_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sinproc *sinproc;

    sinproc = nn_cont (self, struct nn_sinproc, fsm);
    nn_assert (sinproc->fsm.state == 3);

    nn_sinproc_shutdown_events (sinproc, src, type, srcptr);

    /*  ***************  */
    /*  States to check  */
    /*  ***************  */

    /*  Have we got notification that peer is stopped  */
    if (nn_slow (sinproc->state != NN_SINPROC_STATE_STOPPING)) {
        return;
    }

    /*  Are all events processed? We can't cancel them unfortunately  */
    if (nn_fsm_event_active (&sinproc->event_received)
        || nn_fsm_event_active (&sinproc->event_disconnect))
    {
        return;
    }
    /*  These events are deemed to be impossible here  */
    nn_assert (!nn_fsm_event_active (&sinproc->event_connect));
    nn_assert (!nn_fsm_event_active (&sinproc->event_sent));

    /*  **********************************************  */
    /*  All checks are successful. Just stop right now  */
    /*  **********************************************  */

    nn_fsm_stopped (&sinproc->fsm, NN_SINPROC_STOPPED);
    return;
}